

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::checkMouseMove
          (QAbstractItemViewPrivate *this,QPersistentModelIndex *index)

{
  long lVar1;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  QModelIndex local_a0;
  QArrayDataPointer<char16_t> local_88;
  QStatusTipEvent tip;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  setHoverIndex(this,index);
  if (this->viewportEnteredNeeded == false) {
    bVar3 = ::operator!=(&this->enteredIndex,index);
    if (!bVar3) goto LAB_004dff8f;
  }
  this->viewportEnteredNeeded = false;
  cVar4 = QPersistentModelIndex::isValid();
  if (cVar4 == '\0') {
    if ((*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10 != 0) && (this->shouldClearStatusTip == true)) {
      local_88.size = 0;
      local_88.d = (Data *)0x0;
      local_88.ptr = (char16_t *)0x0;
      _tip = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&local_88);
      QCoreApplication::sendEvent
                (*(QObject **)
                  &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10,(QEvent *)&tip);
      QStatusTipEvent::~QStatusTipEvent(&tip);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    QAbstractItemView::viewportEntered(this_00);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&tip,index);
    QAbstractItemView::entered(this_00,(QModelIndex *)&tip);
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = this->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a0,index);
    (**(code **)(*(long *)pQVar2 + 0x90))(&tip,pQVar2,&local_a0,4);
    ::QVariant::toString();
    ::QVariant::~QVariant((QVariant *)&tip);
    if ((*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10 != 0) &&
       ((this->shouldClearStatusTip != false || ((undefined1 *)local_88.size != (undefined1 *)0x0)))
       ) {
      _tip = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent(&tip,(QString *)&local_88);
      QCoreApplication::sendEvent
                (*(QObject **)
                  &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
                   .field_0x10,(QEvent *)&tip);
      this->shouldClearStatusTip = (undefined1 *)local_88.size != (undefined1 *)0x0;
      QStatusTipEvent::~QStatusTipEvent(&tip);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QPersistentModelIndex::operator=(&this->enteredIndex,index);
LAB_004dff8f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::checkMouseMove(const QPersistentModelIndex &index)
{
    //we take a persistent model index because the model might change by emitting signals
    Q_Q(QAbstractItemView);
    setHoverIndex(index);
    if (viewportEnteredNeeded || enteredIndex != index) {
        viewportEnteredNeeded = false;

        if (index.isValid()) {
            emit q->entered(index);
#if QT_CONFIG(statustip)
            QString statustip = model->data(index, Qt::StatusTipRole).toString();
            if (parent && (shouldClearStatusTip || !statustip.isEmpty())) {
                QStatusTipEvent tip(statustip);
                QCoreApplication::sendEvent(parent, &tip);
                shouldClearStatusTip = !statustip.isEmpty();
            }
#endif
        } else {
#if QT_CONFIG(statustip)
            if (parent && shouldClearStatusTip) {
                QString emptyString;
                QStatusTipEvent tip( emptyString );
                QCoreApplication::sendEvent(parent, &tip);
            }
#endif
            emit q->viewportEntered();
        }
        enteredIndex = index;
    }
}